

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

int run_test_poll_bad_fdtype(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  uv_poll_t poll_handle;
  undefined1 auStack_a8 [160];
  
  iVar1 = open64(".",0);
  if (iVar1 == -1) {
    pcVar4 = "fd != -1";
    uVar3 = 0x269;
  }
  else {
    uVar3 = uv_default_loop();
    iVar2 = uv_poll_init(uVar3,auStack_a8,iVar1);
    if (iVar2 == 0) {
      pcVar4 = "0 != uv_poll_init(uv_default_loop(), &poll_handle, fd)";
      uVar3 = 0x26a;
    }
    else {
      iVar1 = close(iVar1);
      if (iVar1 == 0) {
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        uVar3 = uv_default_loop();
        iVar1 = uv_loop_close(uVar3);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar4 = "0 == uv_loop_close(uv_default_loop())";
        uVar3 = 0x26e;
      }
      else {
        pcVar4 = "0 == close(fd)";
        uVar3 = 0x26b;
      }
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(poll_bad_fdtype) {
#if !defined(__DragonFly__) && !defined(__FreeBSD__) && !defined(__sun) && \
    !defined(_AIX) && !defined(__MVS__) && !defined(__FreeBSD_kernel__) && \
    !defined(__OpenBSD__) && !defined(__CYGWIN__) && !defined(__MSYS__) && \
    !defined(__NetBSD__)
  uv_poll_t poll_handle;
  int fd;

#if defined(_WIN32)
  fd = open("test/fixtures/empty_file", O_RDONLY);
#else
  fd = open(".", O_RDONLY);
#endif
  ASSERT(fd != -1);
  ASSERT(0 != uv_poll_init(uv_default_loop(), &poll_handle, fd));
  ASSERT(0 == close(fd));
#endif

  MAKE_VALGRIND_HAPPY();
  return 0;
}